

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::JavascriptNativeFloatArray::JavascriptNativeFloatArray
          (JavascriptNativeFloatArray *this,JavascriptNativeFloatArray *instance,bool boxHead,
          bool deepCopy)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type TVar5;
  undefined7 in_register_00000011;
  
  JavascriptNativeArray::JavascriptNativeArray
            (&this->super_JavascriptNativeArray,&instance->super_JavascriptNativeArray,deepCopy);
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01394300;
  if ((int)CONCAT71(in_register_00000011,boxHead) != 0) {
    JavascriptArray::InitBoxedInlineSegments<Js::JavascriptNativeFloatArray>
              ((JavascriptArray *)this,instance,deepCopy);
    return;
  }
  if ((this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr !=
      (instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x3027,"(head == instance->head)","head == instance->head");
    if (!bVar3) goto LAB_00a5498b;
    *puVar4 = 0;
  }
  TVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion;
  TVar5 = (Type)JavascriptArray::GetLastUsedSegment((JavascriptArray *)instance);
  if (TVar1 != TVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x3028,
                                "(segmentUnion.lastUsedSegment == instance->GetLastUsedSegment())",
                                "segmentUnion.lastUsedSegment == instance->GetLastUsedSegment()");
    if (!bVar3) {
LAB_00a5498b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

JavascriptNativeFloatArray::JavascriptNativeFloatArray(JavascriptNativeFloatArray * instance, bool boxHead, bool deepCopy) :
        JavascriptNativeArray(instance, deepCopy)
    {
        if (boxHead)
        {
            InitBoxedInlineSegments(instance, deepCopy);
        }
        else
        {
            // Base class ctor should have copied these
            Assert(head == instance->head);
            Assert(segmentUnion.lastUsedSegment == instance->GetLastUsedSegment());
        }
    }